

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlRegRangePtr
xmlRegNewRange(xmlRegParserCtxtPtr ctxt,int neg,xmlRegAtomType type,int start,int end)

{
  xmlRegRangePtr pxVar1;
  
  pxVar1 = (xmlRegRangePtr)(*xmlMalloc)(0x18);
  if (pxVar1 == (xmlRegRangePtr)0x0) {
    ctxt->error = 2;
    pxVar1 = (xmlRegRangePtr)0x0;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
  }
  else {
    pxVar1->neg = neg;
    pxVar1->type = type;
    pxVar1->start = start;
    pxVar1->end = end;
  }
  return pxVar1;
}

Assistant:

static xmlRegRangePtr
xmlRegNewRange(xmlRegParserCtxtPtr ctxt,
	       int neg, xmlRegAtomType type, int start, int end) {
    xmlRegRangePtr ret;

    ret = (xmlRegRangePtr) xmlMalloc(sizeof(xmlRegRange));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt);
	return(NULL);
    }
    ret->neg = neg;
    ret->type = type;
    ret->start = start;
    ret->end = end;
    return(ret);
}